

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string_view name)

{
  void *pvVar1;
  Symbol SVar2;
  ulong __n_00;
  ulong uVar3;
  ulong uVar4;
  size_type __n;
  string_view key;
  
  key._M_str = name._M_str;
  __n_00 = name._M_len;
  do {
    if (__n_00 != 0) {
      pvVar1 = memchr(key._M_str,0x2e,__n_00);
      uVar4 = (long)pvVar1 - (long)key._M_str;
      if (uVar4 != 0xffffffffffffffff && pvVar1 != (void *)0x0) {
        while( true ) {
          uVar3 = uVar4;
          if (__n_00 < uVar4) {
            uVar3 = __n_00;
          }
          key._M_len = uVar3;
          SVar2 = Tables::FindSymbol((this->tables_)._M_t.
                                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                     .
                                     super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                                     ._M_head_impl,key);
          if ((SVar2.ptr_)->symbol_type_ == '\0') break;
          if (1 < (byte)((SVar2.ptr_)->symbol_type_ - 9)) {
            return true;
          }
          uVar4 = uVar4 + 1;
          if (((__n_00 < uVar4 || __n_00 - uVar4 == 0) ||
              (pvVar1 = memchr(key._M_str + uVar4,0x2e,__n_00 - uVar4), pvVar1 == (void *)0x0)) ||
             (uVar4 = (long)pvVar1 - (long)key._M_str, uVar4 == 0xffffffffffffffff)) break;
        }
      }
    }
    this = this->underlay_;
    if (this == (DescriptorPool *)0x0) {
      return false;
    }
  } while( true );
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(absl::string_view name) const {
  for (size_t pos = name.find('.'); pos != name.npos;
       pos = name.find('.', pos + 1)) {
    auto prefix = name.substr(0, pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    if (symbol.IsNull()) {
      break;
    }
    if (!symbol.IsPackage()) {
      // If the symbol type is anything other than PACKAGE, then its complete
      // definition is already known.
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}